

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logs.c
# Opt level: O3

int lwsl_timestamp(int level,char *p,int len)

{
  tm *ptVar1;
  tm *ptVar2;
  char **ppcVar3;
  int iVar4;
  ulong uVar5;
  time_t o_now;
  timeval tv;
  tm tm;
  
  iVar4 = 0;
  gettimeofday((timeval *)&tv,(__timezone_ptr_t)0x0);
  o_now = tv.tv_sec;
  ptVar1 = localtime_r(&o_now,(tm *)&tm);
  ptVar2 = (tm *)0x0;
  if (ptVar1 != (tm *)0x0) {
    ptVar2 = (tm *)&tm;
  }
  uVar5 = tv.tv_usec / 100 + tv.tv_sec * 10000;
  *p = '\0';
  ppcVar3 = log_level_names;
  do {
    if (1 << ((byte)iVar4 & 0x1f) == level) {
      if (ptVar2 != (tm *)0x0) {
        iVar4 = lws_snprintf(p,(long)len,"[%04d/%02d/%02d %02d:%02d:%02d:%04d] %s: ",
                             (ulong)(ptVar2->tm_year + 0x76c),(ulong)(ptVar2->tm_mon + 1),
                             (ulong)(uint)ptVar2->tm_mday,(ulong)(uint)ptVar2->tm_hour,
                             (ulong)(uint)ptVar2->tm_min,(ulong)(uint)ptVar2->tm_sec,
                             (ulong)(uint)((int)uVar5 + (int)(uVar5 / 10000) * -10000),*ppcVar3);
        return iVar4;
      }
      iVar4 = lws_snprintf(p,(long)len,"[%llu:%04d] %s: ",uVar5 / 10000,
                           (ulong)(uint)((int)uVar5 + (int)(uVar5 / 10000) * -10000),*ppcVar3);
      return iVar4;
    }
    iVar4 = iVar4 + 1;
    ppcVar3 = ppcVar3 + 1;
  } while (iVar4 != 0xc);
  return 0;
}

Assistant:

int
lwsl_timestamp(int level, char *p, int len)
{
#ifndef LWS_PLAT_OPTEE
	time_t o_now;
	unsigned long long now;
	struct timeval tv;
	struct tm *ptm = NULL;
#ifndef WIN32
	struct tm tm;
#endif
	int n;

	gettimeofday(&tv, NULL);
	o_now = tv.tv_sec;
	now = ((unsigned long long)tv.tv_sec * 10000) + (tv.tv_usec / 100);

#ifndef _WIN32_WCE
#ifdef WIN32
	ptm = localtime(&o_now);
#else
	if (localtime_r(&o_now, &tm))
		ptm = &tm;
#endif
#endif
	p[0] = '\0';
	for (n = 0; n < LLL_COUNT; n++) {
		if (level != (1 << n))
			continue;

		if (ptm)
			n = lws_snprintf(p, len,
				"[%04d/%02d/%02d %02d:%02d:%02d:%04d] %s: ",
				ptm->tm_year + 1900,
				ptm->tm_mon + 1,
				ptm->tm_mday,
				ptm->tm_hour,
				ptm->tm_min,
				ptm->tm_sec,
				(int)(now % 10000), log_level_names[n]);
		else
			n = lws_snprintf(p, len, "[%llu:%04d] %s: ",
					(unsigned long long) now / 10000,
					(int)(now % 10000), log_level_names[n]);
		return n;
	}
#else
	p[0] = '\0';
#endif

	return 0;
}